

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSupertype
          (HeapTypeGeneratorImpl *this,Type type)

{
  __index_type _Var1;
  pointer pvVar2;
  HeapTypeGeneratorImpl *pHVar3;
  Shareability SVar4;
  bool bVar5;
  undefined4 uVar6;
  BasicHeapType BVar7;
  size_t __n;
  Type *pTVar8;
  uintptr_t *puVar9;
  uintptr_t uVar10;
  iterator iVar11;
  _Optional_payload_base<unsigned_int> _Var12;
  value_type *pvVar13;
  HeapType HVar14;
  uint uVar15;
  Nullability NVar16;
  undefined1 auVar17 [8];
  Exactness EVar18;
  Iterator IVar19;
  HeapType local_90;
  Type local_88;
  Type type_local;
  Type local_78;
  HeapTypeGeneratorImpl *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  undefined1 local_48 [8];
  Iterator __begin3;
  
  local_88.id = type.id;
  local_70 = this;
  if ((type.id & 1) != 0 && 6 < type.id) {
    auStack_68 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = Type::size(&local_88);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68,__n);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_48 = (undefined1  [8])&local_88;
    IVar19 = Type::end(&local_88);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar19.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    pTVar8 = (Type *)0x0;
    auVar17 = (undefined1  [8])&local_88;
    while ((pTVar8 != (Type *)IVar19.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index ||
           (auVar17 !=
            (undefined1  [8])
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index))) {
      puVar9 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_48);
      local_78 = generateSupertype(local_70,*puVar9);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68,&local_78);
      pTVar8 = (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      auVar17 = local_48;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar8;
    }
    uVar10 = ::wasm::TypeBuilder::getTempTupleType(local_70->builder);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68);
    return (Type)uVar10;
  }
  if ((type.id & 1) != 0 || type.id < 7) {
    if (type.id < 7) {
      return (Type)type.id;
    }
    ::wasm::handle_unreachable
              ("unexpected type kind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x253);
  }
  local_78.id = (uintptr_t)Type::getHeapType(&local_88);
  pHVar3 = local_70;
  if (local_88.id < 7 || ((uint)local_88.id & 3) != 2) {
    bVar5 = Random::oneIn(local_70->rand,2);
    EVar18 = (Exactness)bVar5;
  }
  else {
    EVar18 = Exact;
  }
  uVar6 = ::wasm::HeapType::getShared();
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       CONCAT44(__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index.
                _4_4_,uVar6);
  auStack_68 = (undefined1  [8])0x0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar11 = std::
           _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(pHVar3->typeIndices)._M_h,(key_type *)&local_78);
  if (iVar11.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
      != (__node_type *)0x0) {
    _Var12._4_4_ = 0;
    _Var12._M_payload._M_value =
         *(uint *)((long)iVar11.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                         ._M_cur + 0x10);
    uVar15 = 1;
    type_local.id._4_4_ = EVar18;
    while (pHVar3 = local_70, EVar18 = type_local.id._4_4_, (char)uVar15 != '\0') {
      local_48 = (undefined1  [8])local_70->builder;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((ulong)_Var12 & 0xffffffff);
      local_90 = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)local_48);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,&local_90);
      _Var12 = *(_Optional_payload_base<unsigned_int> *)
                ((local_70->supertypeIndices).
                 super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)((ulong)_Var12 & 0xffffffff));
      uVar15 = _Var12._4_4_ & 1;
    }
    pvVar2 = (local_70->typeKinds).
             super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar2 == (pointer)0x0) {
LAB_001ad5ec:
      ::wasm::handle_unreachable
                ("unexpected kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0x1ed);
    }
    _Var1 = *(__index_type *)
             ((long)&pvVar2[*(uint *)((long)iVar11.
                                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                            ._M_cur + 0x10)].
                     super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             + 1);
    SVar4 = (Shareability)
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    if (_Var1 == '\0') {
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::func,
                                 (Shareability)
                                 __begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
    }
    else if (_Var1 == '\x01') {
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::struct_,
                                 (Shareability)
                                 __begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::eq,SVar4);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::any,SVar4);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
    }
    else {
      if (_Var1 != '\x02') goto LAB_001ad5ec;
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::array,
                                 (Shareability)
                                 __begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::eq,SVar4);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
      BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::any,SVar4);
      local_48 = (undefined1  [8])(ulong)BVar7;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
                 (HeapType *)local_48);
    }
    pvVar13 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                        (pHVar3->rand,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68);
    goto LAB_001ad5b6;
  }
  if (0x7c < local_78.id) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1f1,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
             (value_type *)&local_78);
  BVar7 = HeapType::getBasic((HeapType *)&local_78,Unshared);
  pHVar3 = local_70;
  SVar4 = (Shareability)
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  switch(BVar7 << 0x1d | BVar7 - ext >> 3) {
  case 4:
    BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::any,
                               (Shareability)
                               __begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
    local_48 = (undefined1  [8])(ulong)BVar7;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
               (HeapType *)local_48);
    break;
  case 5:
  case 6:
  case 7:
    BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::eq,
                               (Shareability)
                               __begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
    local_48 = (undefined1  [8])(ulong)BVar7;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
               (HeapType *)local_48);
    BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::any,SVar4);
    local_48 = (undefined1  [8])(ulong)BVar7;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
               (HeapType *)local_48);
    break;
  case 9:
    BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::ext,
                               (Shareability)
                               __begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
    local_48 = (undefined1  [8])(ulong)BVar7;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
               (HeapType *)local_48);
    break;
  case 10:
    HVar14 = pickSubAny(local_70,(Shareability)
                                 __begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index);
    NVar16 = (Nullability)HVar14.id;
    goto LAB_001ad5b9;
  case 0xb:
    BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::ext,
                               (Shareability)
                               __begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
    local_48 = (undefined1  [8])(ulong)BVar7;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
               (HeapType *)local_48);
    break;
  case 0xc:
    HVar14 = pickSubFunc(local_70,(Shareability)
                                  __begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
    NVar16 = (Nullability)HVar14.id;
    goto LAB_001ad5b9;
  case 0xd:
    ::wasm::handle_unreachable
              ("not implemented",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x20b);
  case 0xe:
    BVar7 = HeapType::getBasic((HeapType *)&HeapTypes::exn,
                               (Shareability)
                               __begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
    local_48 = (undefined1  [8])(ulong)BVar7;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
               (HeapType *)local_48);
  }
  if (auStack_68 ==
      (undefined1  [8])
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assert_fail("!candidates.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x213,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  pvVar13 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                      (pHVar3->rand,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68);
LAB_001ad5b6:
  NVar16 = (Nullability)pvVar13->id;
LAB_001ad5b9:
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68);
  uVar10 = ::wasm::TypeBuilder::getTempRefType((HeapType)local_70->builder,NVar16,EVar18);
  return (Type)uVar10;
}

Assistant:

Type generateSupertype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSupertype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSuperRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have supertypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }